

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O3

void __thiscall UnitTest_lex1::Run(UnitTest_lex1 *this)

{
  CharInStream *pCVar1;
  int iVar2;
  LexerWrapper lexer;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined4 local_150;
  LexerWrapper local_140;
  
  local_168.str_ = (String *)&local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"\r\n\t\v\f ","");
  anon_unknown.dwarf_3ac4::LexerWrapper::LexerWrapper(&local_140,(string *)&local_168);
  if (local_168.str_ != (String *)&local_158) {
    operator_delete(local_168.str_);
  }
  local_168.number_ = 0.0;
  uStack_160 = 0;
  local_158 = 0;
  local_150 = 0x11e;
  iVar2 = luna::Lexer::GetToken(&local_140.lexer_,(TokenDetail *)&local_168);
  if (iVar2 != 0x11e) {
    local_168.str_ = (String *)&local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"\'lexer.GetToken() == luna::Token_EOF\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,(string *)&local_168);
    if (local_168.str_ != (String *)&local_158) {
      operator_delete(local_168.str_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.lexer_.token_buffer_._M_dataplus._M_p != &local_140.lexer_.token_buffer_.field_2)
  {
    operator_delete(local_140.lexer_.token_buffer_._M_dataplus._M_p);
  }
  if (local_140.lexer_.in_stream_.super__Function_base._M_manager != (_Manager_type)0x0) {
    pCVar1 = &local_140.lexer_.in_stream_;
    (*local_140.lexer_.in_stream_.super__Function_base._M_manager)
              ((_Any_data *)pCVar1,(_Any_data *)pCVar1,__destroy_functor);
  }
  luna::String::~String(&local_140.name_);
  luna::State::~State(&local_140.state_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.iss_.str_._M_dataplus._M_p != &local_140.iss_.str_.field_2) {
    operator_delete(local_140.iss_.str_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_CASE(lex1)
{
    LexerWrapper lexer("\r\n\t\v\f ");
    EXPECT_TRUE(lexer.GetToken() == luna::Token_EOF);
}